

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeImportTableSet(TranslateToFuzzReader *this,Type type)

{
  char *pcVar1;
  size_t sVar2;
  Call *pCVar3;
  initializer_list<wasm::Expression_*> __l;
  Name target;
  Expression *local_68;
  Expression *local_60;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_58;
  Type local_40;
  allocator_type local_31;
  
  if (type.id != 0) {
    __assert_fail("type == Type::none",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x4e8,"Expression *wasm::TranslateToFuzzReader::makeImportTableSet(Type)");
  }
  pcVar1 = (this->tableSetImportName).super_IString.str._M_str;
  if (pcVar1 != (char *)0x0) {
    sVar2 = (this->tableSetImportName).super_IString.str._M_len;
    local_68 = make(this,(Type)0x2);
    Type::Type(&local_40,(HeapType)0x10,Nullable,Inexact);
    local_60 = makeBasicRef(this,local_40);
    __l._M_len = 2;
    __l._M_array = &local_68;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&local_58,__l,
               &local_31);
    target.super_IString.str._M_str = pcVar1;
    target.super_IString.str._M_len = sVar2;
    pCVar3 = Builder::makeCall(&this->builder,target,
                               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               &local_58,(Type)0x0,false);
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              (&local_58);
    return (Expression *)pCVar3;
  }
  __assert_fail("tableSetImportName",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x4e9,"Expression *wasm::TranslateToFuzzReader::makeImportTableSet(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeImportTableSet(Type type) {
  assert(type == Type::none);
  assert(tableSetImportName);
  return builder.makeCall(
    tableSetImportName,
    {make(Type::i32), makeBasicRef(Type(HeapType::func, Nullable))},
    Type::none);
}